

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O0

void __thiscall Json_TwoKeywords_Test::TestBody(Json_TwoKeywords_Test *this)

{
  bool bVar1;
  char *pcVar2;
  error_code *lhs;
  error_code eVar3;
  AssertHelper local_1b8;
  Message local_1b0;
  coord local_1a8;
  coord local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_2;
  Message local_180;
  error_code local_178;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  string res;
  string local_e8;
  undefined1 local_c8 [8];
  parser<json_out_callbacks> p;
  Json_TwoKeywords_Test *this_local;
  
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8.field_2._8_8_ = 0;
  local_e8._M_dataplus = (_Alloc_hider)0x0;
  local_e8._1_7_ = 0;
  local_e8._M_string_length = 0;
  p.coordinate_ = (coord)this;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_e8);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_c8,(json_out_callbacks *)&local_e8,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_e8);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&res.field_2 + 8)," true false ",0xc);
  pstore::json::parser<json_out_callbacks>::input
            ((parser<json_out_callbacks> *)local_c8,(string *)((long)&res.field_2 + 8));
  std::__cxx11::string::~string((string *)(res.field_2._M_local_buf + 8));
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
            ((result_type *)&gtest_ar.message_,(parser<json_out_callbacks> *)local_c8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_148,"res","\"\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [1])0x1f640a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  lhs = pstore::json::parser<json_out_callbacks>::last_error((parser<json_out_callbacks> *)local_c8)
  ;
  eVar3 = pstore::json::make_error_code(unexpected_extra_input);
  local_178._M_cat = eVar3._M_cat;
  local_178._M_value = eVar3._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_168,"p.last_error ()",
             "make_error_code (json::error_code::unexpected_extra_input)",lhs,&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1a0 = pstore::json::parser<json_out_callbacks>::coordinate
                        ((parser<json_out_callbacks> *)local_c8);
  pstore::json::coord::coord(&local_1a8,7,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_198,"p.coordinate ()","(json::coord{7U, 1U})",&local_1a0,&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_c8);
  return;
}

Assistant:

TEST_F (Json, TwoKeywords) {
    json::parser<json_out_callbacks> p;
    p.input (" true false "s);
    std::string const res = p.eof ();
    EXPECT_EQ (res, "");
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::unexpected_extra_input));
    EXPECT_EQ (p.coordinate (), (json::coord{7U, 1U}));
}